

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_equal(lua_State *L,int index1,int index2)

{
  uint uVar1;
  int iVar2;
  TValue *t1;
  TValue *t2;
  
  t1 = index2adr(L,index1);
  t2 = index2adr(L,index2);
  uVar1 = 0;
  if ((t2 != &luaO_nilobject_ && t1 != &luaO_nilobject_) && (t1->tt == t2->tt)) {
    iVar2 = luaV_equalval(L,t1,t2);
    uVar1 = (uint)(iVar2 != 0);
  }
  return uVar1;
}

Assistant:

LUA_API int lua_equal (lua_State *L, int index1, int index2) {
  StkId o1, o2;
  int i;
  lua_lock(L);  /* may call tag method */
  o1 = index2adr(L, index1);
  o2 = index2adr(L, index2);
  i = (o1 == luaO_nilobject || o2 == luaO_nilobject) ? 0 : equalobj(L, o1, o2);
  lua_unlock(L);
  return i;
}